

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O3

void __thiscall
ArchiveSpan_WriteSingleElementSpan_Test::TestBody(ArchiveSpan_WriteSingleElementSpan_Test *this)

{
  TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)> *pTVar1;
  ActionInterface<pstore::serialize::archive::void_type_(const_int_&)> *impl;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_00;
  int a;
  mock_span_archive archive;
  undefined1 local_1a8 [16];
  Buffer local_198;
  MockSpec<pstore::serialize::archive::void_type_(const_int_&)> local_188;
  void_type *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  MatcherBase<const_int_&> local_158;
  mock_span_archive local_140;
  
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_140);
  local_140.gmock01_put_280.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198a70;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_140.gmock01_get_281.super_UntypedFunctionMockerBase);
  local_140.gmock01_get_281.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198bd0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_140.gmock01_putn_mock_285.super_UntypedFunctionMockerBase);
  local_140.gmock01_putn_mock_285.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198e28;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_140.gmock01_getn_mock_286.super_UntypedFunctionMockerBase);
  local_140.gmock01_getn_mock_286.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198f88;
  local_158.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<int_const&>::
       GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_158.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198b30;
  anon_unknown.dwarf_7baea::ArchiveSpan::mock_span_archive::gmock_put
            (&local_188,&local_140,(Matcher<const_int_&> *)&local_158);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::MockSpec<pstore::serialize::archive::void_type_(const_int_&)>::
           InternalExpectedAt(&local_188,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                              ,0x145,"archive","put (_)");
  pTVar1 = testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>
           ::Times(pTVar1,1);
  local_168 = (void_type *)operator_new(1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::serialize::archive::void_type*>(&local_160,local_168);
  impl = (ActionInterface<pstore::serialize::archive::void_type_(const_int_&)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00199348;
  testing::Action<pstore::serialize::archive::void_type_(const_int_&)>::Action
            ((Action<pstore::serialize::archive::void_type_(const_int_&)> *)local_1a8,impl);
  testing::internal::TypedExpectation<pstore::serialize::archive::void_type_(const_int_&)>::WillOnce
            (pTVar1,(Action<pstore::serialize::archive::void_type_(const_int_&)> *)local_1a8);
  if ((_Manager_type)local_198.ptr != (_Manager_type)0x0) {
    (*(code *)local_198)(local_1a8,local_1a8,3);
  }
  if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
  }
  testing::internal::MatcherBase<const_int_&>::~MatcherBase
            ((MatcherBase<const_int_&> *)&local_188.matchers_);
  testing::internal::MatcherBase<const_int_&>::~MatcherBase(&local_158);
  local_1a8._8_8_ =
       testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_1a8._0_8_ = &PTR__MatcherBase_00198ee8;
  anon_unknown.dwarf_7baea::ArchiveSpan::mock_span_archive::gmock_putn_mock
            ((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *)
             &local_188,&local_140,(Matcher<pstore::gsl::span<int,__1L>_> *)local_1a8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
            InternalExpectedAt((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
                                *)&local_188,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                               ,0x146,"archive","putn_mock (_)");
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Times
            (this_00,0);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)&local_188.matchers_);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)local_1a8);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            ((UntypedFunctionMockerBase *)&local_140,&local_140,"put");
  testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::Invoke
            (&local_140.gmock01_put_280,(int *)&local_188);
  testing::internal::FunctionMocker<void_(pstore::gsl::span<int,_-1L>)>::~FunctionMocker
            (&local_140.gmock01_getn_mock_286);
  testing::internal::
  FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
  ~FunctionMocker(&local_140.gmock01_putn_mock_285);
  testing::internal::FunctionMocker<void_(int_&)>::~FunctionMocker(&local_140.gmock01_get_281);
  testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::
  ~FunctionMocker(&local_140.gmock01_put_280);
  return;
}

Assistant:

TEST_F (ArchiveSpan, WriteSingleElementSpan) {
    using ::testing::_;
    using ::testing::Return;

    mock_span_archive archive;
    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (archive, put (_)).Times (1).WillOnce (Return (ret));
    EXPECT_CALL (archive, putn_mock (_)).Times (0);

    int a;
    pstore::serialize::write (archive, ::pstore::gsl::span<int, 1> (&a, 1));
}